

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field.hh
# Opt level: O1

void discordpp::from_json(json *j,field<discordpp::Snowflake> *f)

{
  Snowflake SVar1;
  _Head_base<0UL,_discordpp::Snowflake_*,_false> _Var2;
  state sVar3;
  _Head_base<0UL,_discordpp::Snowflake_*,_false> _Var4;
  Snowflake ret;
  Snowflake local_20;
  
  if (j->m_type == null) {
    _Var4._M_head_impl =
         (f->t_)._M_t.
         super___uniq_ptr_impl<discordpp::Snowflake,_std::default_delete<discordpp::Snowflake>_>.
         _M_t.
         super__Tuple_impl<0UL,_discordpp::Snowflake_*,_std::default_delete<discordpp::Snowflake>_>.
         super__Head_base<0UL,_discordpp::Snowflake_*,_false>._M_head_impl;
    (f->t_)._M_t.
    super___uniq_ptr_impl<discordpp::Snowflake,_std::default_delete<discordpp::Snowflake>_>._M_t.
    super__Tuple_impl<0UL,_discordpp::Snowflake_*,_std::default_delete<discordpp::Snowflake>_>.
    super__Head_base<0UL,_discordpp::Snowflake_*,_false>._M_head_impl = (Snowflake *)0x0;
    sVar3 = nulled_e;
  }
  else {
    local_20._value = 0;
    from_json(j,&local_20);
    SVar1._value = local_20._value;
    _Var2._M_head_impl = (Snowflake *)operator_new(8);
    (_Var2._M_head_impl)->_value = SVar1._value;
    _Var4._M_head_impl =
         (f->t_)._M_t.
         super___uniq_ptr_impl<discordpp::Snowflake,_std::default_delete<discordpp::Snowflake>_>.
         _M_t.
         super__Tuple_impl<0UL,_discordpp::Snowflake_*,_std::default_delete<discordpp::Snowflake>_>.
         super__Head_base<0UL,_discordpp::Snowflake_*,_false>._M_head_impl;
    (f->t_)._M_t.
    super___uniq_ptr_impl<discordpp::Snowflake,_std::default_delete<discordpp::Snowflake>_>._M_t.
    super__Tuple_impl<0UL,_discordpp::Snowflake_*,_std::default_delete<discordpp::Snowflake>_>.
    super__Head_base<0UL,_discordpp::Snowflake_*,_false>._M_head_impl = _Var2._M_head_impl;
    sVar3 = present_e;
  }
  if (_Var4._M_head_impl != (Snowflake *)0x0) {
    operator_delete(_Var4._M_head_impl,8);
  }
  f->s_ = sVar3;
  return;
}

Assistant:

void from_json(const nlohmann::json &j, field<T> &f) {
        if (j.is_null()) {
            f.t_ = nullptr;
            f.s_ = nulled_e;
        } else {
            f.t_ = std::make_unique<T>(j.get<T>());
            f.s_ = present_e;
        }
    }